

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O3

void __thiscall gutil::Parameter::nextParameter(Parameter *this,string *p)

{
  ulong uVar1;
  pointer pbVar2;
  iterator iVar3;
  IOException *pIVar4;
  string local_40;
  
  uVar1 = this->pos;
  pbVar2 = (this->list).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->list).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar1) {
    pIVar4 = (IOException *)__cxa_allocate_exception(0x28);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"There are no more parameters!","");
    IOException::IOException(pIVar4,&local_40);
    __cxa_throw(pIVar4,&IOException::typeinfo,Exception::~Exception);
  }
  if (*pbVar2[uVar1]._M_dataplus._M_p == '-') {
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->allparam)._M_t,pbVar2 + uVar1);
    if ((_Rb_tree_header *)iVar3._M_node != &(this->allparam)._M_t._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::_M_assign((string *)p);
      this->cparam = this->pos;
      this->pos = this->pos + 1;
      return;
    }
    pIVar4 = (IOException *)__cxa_allocate_exception(0x28);
    std::operator+(&local_40,"Undefined parameter: ",
                   (this->list).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + this->pos);
    IOException::IOException(pIVar4,&local_40);
    __cxa_throw(pIVar4,&IOException::typeinfo,Exception::~Exception);
  }
  pIVar4 = (IOException *)__cxa_allocate_exception(0x28);
  std::operator+(&local_40,"Parameter expected: ",
                 (this->list).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + this->pos);
  IOException::IOException(pIVar4,&local_40);
  __cxa_throw(pIVar4,&IOException::typeinfo,Exception::~Exception);
}

Assistant:

void Parameter::nextParameter(std::string &p)
{
  if (pos < list.size())
  {
    if (list[pos][0] == '-')
    {
      if (allparam.find(list[pos]) != allparam.end())
      {
        p=list[pos];
        cparam=pos;
        pos++;
      }
      else
      {
        throw IOException("Undefined parameter: "+list[pos]);
      }
    }
    else
    {
      throw IOException("Parameter expected: "+list[pos]);
    }
  }
  else
  {
    throw IOException("There are no more parameters!");
  }
}